

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::setVersion(DataDictionary *this,string *beginString)

{
  FieldBase local_70;
  
  BeginString::BeginString((BeginString *)&local_70,beginString);
  FieldBase::operator=((FieldBase *)&this->m_beginString,&local_70);
  FieldBase::~FieldBase(&local_70);
  this->m_hasVersion = true;
  return;
}

Assistant:

void setVersion( const std::string& beginString )
  {
    m_beginString = beginString;
    m_hasVersion = true;
  }